

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  uchar (*pk_parity) [4];
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint64_t uVar5;
  int iVar6;
  int extraout_EAX;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  FILE *__stream;
  size_t sVar12;
  secp256k1_ge *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_context *psVar15;
  secp256k1_scratch *psVar16;
  size_t sVar17;
  void *pvVar18;
  void *pvVar19;
  byte *pbVar20;
  secp256k1_fe *psVar21;
  void *pvVar22;
  byte *pbVar23;
  ulong uVar24;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_scalar *psVar25;
  secp256k1_context *extraout_RDX;
  int iVar26;
  uchar auVar27 [4];
  secp256k1_gej *a;
  secp256k1_ge_storage (*r_00) [2];
  _func_void_char_ptr_void_ptr *p_Var28;
  secp256k1_keypair *keypair;
  uint uVar29;
  long lVar30;
  undefined1 *puVar31;
  uint uVar32;
  ulong uVar33;
  secp256k1_scalar *psVar34;
  undefined1 *puVar35;
  uint64_t *puVar36;
  secp256k1_ge *psVar37;
  undefined8 *puVar38;
  byte *pbVar39;
  secp256k1_gej *psVar40;
  ulong uVar41;
  secp256k1_context *psVar42;
  secp256k1_ge *psVar43;
  ulong uVar44;
  secp256k1_scratch *na;
  uint64_t uVar45;
  ulong uVar46;
  char cVar47;
  secp256k1_scalar sVar48;
  char *pcVar49;
  uchar *puVar50;
  secp256k1_context *a_00;
  secp256k1_xonly_pubkey *psVar51;
  bool bVar52;
  byte bVar53;
  undefined1 auVar54 [16];
  secp256k1_fe i;
  secp256k1_gej rj;
  secp256k1_ge p;
  FILE *pFStack_1cd8;
  ulong uStack_1cd0;
  ulong uStack_1cc8;
  uchar auStack_1cbc [4];
  secp256k1_context *psStack_1cb8;
  undefined1 auStack_1cac [4];
  undefined1 *puStack_1ca8;
  undefined1 *puStack_1ca0;
  secp256k1_gej *psStack_1c98;
  secp256k1_scalar sStack_1c8c;
  undefined1 auStack_1c88 [32];
  undefined1 auStack_1c68 [16];
  undefined1 auStack_1c58 [16];
  undefined1 auStack_1c48 [16];
  undefined4 uStack_1c38;
  undefined1 auStack_1c28 [16];
  undefined1 auStack_1c18 [16];
  int iStack_1bfc;
  undefined1 auStack_1bf8 [96];
  undefined1 auStack_1b98 [16];
  undefined1 auStack_1b88 [16];
  uint64_t uStack_1b70;
  undefined4 uStack_1b64;
  ulong uStack_1b60;
  _func_void_char_ptr_void_ptr *p_Stack_1b58;
  uint64_t *puStack_1b50;
  _func_void_char_ptr_void_ptr *p_Stack_1b48;
  secp256k1_scratch *psStack_1b40;
  ulong uStack_1b38;
  secp256k1_scratch *psStack_1b30;
  undefined1 *puStack_1b28;
  ulong uStack_1b20;
  undefined1 auStack_1b18 [16];
  undefined1 auStack_1b08 [16];
  undefined1 auStack_1af8 [16];
  undefined1 auStack_1ae8 [16];
  undefined1 auStack_19b8 [32];
  byte abStack_1998 [8];
  undefined8 auStack_1990 [3];
  undefined1 auStack_1978 [16];
  undefined1 auStack_1968 [16];
  uchar auStack_1958 [4];
  uchar auStack_1954 [4];
  int iStack_1950;
  int iStack_194c;
  secp256k1_keypair sStack_16d8;
  secp256k1_context asStack_1678 [5];
  undefined1 auStack_11f8 [16];
  undefined1 auStack_11e8 [16];
  uint64_t uStack_11d8;
  uint64_t uStack_11d0;
  undefined1 auStack_11c8 [32];
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  int iStack_11a0;
  int iStack_119c;
  int iStack_1198;
  undefined1 auStack_ef8 [32];
  undefined4 uStack_ed8;
  undefined4 uStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  uchar auStack_ec8 [8];
  size_t asStack_ec0 [2];
  size_t sStack_eb0;
  uchar auStack_ea8 [4];
  uchar auStack_ea4 [4];
  int aiStack_ea0 [4];
  secp256k1_context asStack_e90 [5];
  secp256k1_ge sStack_a18;
  undefined1 auStack_9b0 [8];
  undefined1 auStack_9a8 [152];
  secp256k1_context asStack_910 [9];
  secp256k1_gej *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  code *pcStack_1c8;
  secp256k1_gej *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_fe *local_1a0;
  undefined1 local_198 [24];
  uint64_t uStack_180;
  uint64_t local_178;
  int local_170;
  int local_16c;
  secp256k1_fe local_168;
  undefined1 local_138 [24];
  uint64_t uStack_120;
  uint64_t local_118;
  int local_110;
  int local_10c;
  secp256k1_fe local_d8;
  int local_a8;
  secp256k1_ge local_98;
  
  bVar53 = 0;
  psVar14 = (secp256k1_gej *)local_198;
  pcStack_1b0 = (code *)0x11199b;
  secp256k1_fe_sqr((secp256k1_fe *)psVar14,n);
  pcStack_1b0 = (code *)0x1119a9;
  secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar14,n);
  local_1a0 = r;
  if (d == (secp256k1_fe *)0x0) {
    pcStack_1b0 = (code *)0x111b61;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    local_198._0_8_ = local_198._0_8_ + 2;
    local_170 = local_170 + 1;
    local_16c = 0;
    pcStack_1b0 = (code *)0x111b77;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    if (known_on_curve == 0) {
      psVar13 = (secp256k1_ge *)local_198;
LAB_00111b80:
      pcStack_1b0 = (code *)0x111b85;
      iVar6 = secp256k1_fe_is_square_var(&psVar13->x);
      if (iVar6 == 0) {
        return 0;
      }
    }
LAB_00111b8d:
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x111ba5;
    secp256k1_fe_mul(&local_98.x,r,n);
    n = &local_98.y;
    pcStack_1b0 = (code *)0x111bb8;
    secp256k1_fe_sqr(n,r);
    local_98.infinity = 0;
    pcStack_1b0 = (code *)0x111bc9;
    psVar40 = (secp256k1_gej *)q;
    secp256k1_scalar_verify(q);
    if (*q == 0) {
      pcStack_1b0 = (code *)0x111c78;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r = (secp256k1_fe *)local_138;
      pcStack_1b0 = (code *)0x111beb;
      secp256k1_ecmult_const((secp256k1_gej *)r,&local_98,q);
      pcStack_1b0 = (code *)0x111bf3;
      psVar40 = (secp256k1_gej *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_a8 == 0) {
        pcStack_1b0 = (code *)0x111c11;
        secp256k1_fe_sqr(&local_168,&local_d8);
        pcStack_1b0 = (code *)0x111c21;
        secp256k1_fe_mul(&local_168,&local_168,(secp256k1_fe *)local_198);
        if (d != (secp256k1_fe *)0x0) {
          pcStack_1b0 = (code *)0x111c36;
          secp256k1_fe_mul(&local_168,&local_168,d);
        }
        pcStack_1b0 = (code *)0x111c46;
        secp256k1_fe_inv(&local_168,&local_168);
        pcStack_1b0 = (code *)0x111c58;
        secp256k1_fe_mul(local_1a0,(secp256k1_fe *)local_138,&local_168);
        return 1;
      }
    }
    pcStack_1b0 = (code *)0x111c7d;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00111c7d:
    pcStack_1b0 = (code *)0x111c82;
    secp256k1_ecmult_const_xonly_cold_1();
LAB_00111c82:
    pcStack_1b0 = (code *)0x111c87;
    secp256k1_ecmult_const_xonly_cold_3();
  }
  else {
    pcStack_1b0 = (code *)0x1119bf;
    secp256k1_fe_verify(d);
    uVar10 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar24 = (uVar10 >> 0x34) + d->n[1];
    uVar33 = (uVar24 >> 0x34) + d->n[2];
    psVar40 = (secp256k1_gej *)((uVar33 >> 0x34) + d->n[3]);
    uVar44 = ((ulong)psVar40 >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar24 | uVar10 | uVar33 | (ulong)psVar40) & 0xfffffffffffff) == 0 && uVar44 == 0) ||
       (((uVar10 ^ 0x1000003d0) & uVar24 & uVar33 & (ulong)psVar40 & (uVar44 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_00111c7d;
    psVar14 = (secp256k1_gej *)local_138;
    pcStack_1b0 = (code *)0x111a6b;
    secp256k1_fe_sqr((secp256k1_fe *)psVar14,d);
    pcStack_1b0 = (code *)0x111a73;
    psVar40 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    if (0x10 < local_110) goto LAB_00111c82;
    psVar14 = (secp256k1_gej *)local_138;
    local_138._0_8_ = local_138._0_8_ * 2;
    local_138._8_8_ = local_138._8_8_ * 2;
    uStack_120 = uStack_120 * 2;
    local_138._16_8_ = local_138._16_8_ * 2;
    local_118 = local_118 << 1;
    local_110 = local_110 * 2;
    local_10c = 0;
    pcStack_1b0 = (code *)0x111abf;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    pcStack_1b0 = (code *)0x111acd;
    secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar14,d);
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x111ada;
    secp256k1_fe_verify(r);
    pcStack_1b0 = (code *)0x111ae2;
    psVar40 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    if (local_110 + local_170 < 0x21) {
      local_198._0_8_ = local_198._0_8_ + local_138._0_8_;
      local_198._8_8_ = local_198._8_8_ + local_138._8_8_;
      local_198._16_8_ = local_198._16_8_ + local_138._16_8_;
      uStack_180 = uStack_180 + uStack_120;
      local_178 = local_178 + local_118;
      local_16c = 0;
      pcStack_1b0 = (code *)0x111b33;
      local_170 = local_110 + local_170;
      secp256k1_fe_verify((secp256k1_fe *)local_198);
      if (known_on_curve == 0) {
        psVar13 = &local_98;
        pcStack_1b0 = (code *)0x111b4f;
        secp256k1_fe_mul(&psVar13->x,(secp256k1_fe *)local_198,d);
        goto LAB_00111b80;
      }
      goto LAB_00111b8d;
    }
  }
  pcStack_1b0 = secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_1c8 = (code *)0x111cad;
  psStack_1c0 = (secp256k1_gej *)r;
  psStack_1b8 = d;
  pcStack_1b0 = (code *)q;
  secp256k1_fe_verify(&psVar40->x);
  uVar10 = (psVar40->x).n[4];
  uVar24 = (uVar10 >> 0x30) * 0x1000003d1 + (psVar40->x).n[0];
  uVar44 = (uVar24 >> 0x34) + (psVar40->x).n[1];
  uVar33 = (uVar44 >> 0x34) + (psVar40->x).n[2];
  uVar41 = uVar33 & 0xfffffffffffff;
  uVar33 = (uVar33 >> 0x34) + (psVar40->x).n[3];
  uVar10 = (uVar33 >> 0x34) + (uVar10 & 0xffffffffffff);
  uVar24 = uVar24 & 0xfffffffffffff;
  uVar46 = (ulong)(0xffffefffffc2e < uVar24 &&
                  ((uVar41 & uVar44 & uVar33) == 0xfffffffffffff && uVar10 == 0xffffffffffff)) |
           uVar10 >> 0x30;
  uVar24 = uVar46 * 0x1000003d1 + uVar24;
  uVar44 = (uVar24 >> 0x34) + (uVar44 & 0xfffffffffffff);
  psVar34 = (secp256k1_scalar *)((uVar44 >> 0x34) + uVar41);
  uVar33 = ((ulong)psVar34 >> 0x34) + (uVar33 & 0xfffffffffffff);
  uVar10 = (uVar33 >> 0x34) + uVar10;
  if ((uint)(ushort)(uVar10 >> 0x30) == (uint)uVar46) {
    (psVar40->x).n[0] = uVar24 & 0xfffffffffffff;
    (psVar40->x).n[1] = uVar44 & 0xfffffffffffff;
    (psVar40->x).n[2] = (ulong)psVar34 & 0xfffffffffffff;
    (psVar40->x).n[3] = uVar33 & 0xfffffffffffff;
    (psVar40->x).n[4] = uVar10 & 0xffffffffffff;
    (psVar40->x).magnitude = 1;
    (psVar40->x).normalized = 1;
    secp256k1_fe_verify(&psVar40->x);
    return extraout_EAX;
  }
  pcStack_1c8 = main;
  secp256k1_fe_normalize_cold_1();
  uStack_1d0 = 0xfffffffffffff;
  uStack_1d8 = 0xffffffffffff;
  psStack_1f0 = psVar40;
  psStack_1e8 = n;
  psStack_1e0 = psVar14;
  pcStack_1c8 = (code *)(ulong)(uint)known_on_curve;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < (int)uVar33) {
    lVar11 = strtol(*(char **)(psVar34 + 2),(char **)0x0,0);
    count = (int)lVar11;
  }
  pcVar49 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < (int)uVar33) {
    pcVar49 = *(char **)(psVar34 + 4);
  }
  asStack_1678[0].ecmult_gen_ctx.built = 0;
  asStack_1678[0].ecmult_gen_ctx.scalar_offset = 0;
  asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  pFStack_1cd8 = (FILE *)(uVar33 & 0xffffffff);
  auStack_1bf8._64_8_ = psVar34;
  if ((pcVar49 == (char *)0x0) || (*pcVar49 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00114a33;
    sVar12 = fread(asStack_1678,1,0x10,__stream);
    if (sVar12 != 0x10) goto LAB_00114a33;
    goto LAB_00111f07;
  }
  iVar6 = 0;
  while ((((iVar6 < 0x10 && (*pcVar49 != '\0')) && (pcVar49[1] != '\0')) &&
         (iVar7 = __isoc99_sscanf(pcVar49,"%2hx",auStack_9a8), iVar7 == 1))) {
    *(undefined1 *)((long)asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n + (long)iVar6 + -8) =
         auStack_9a8[0];
    pcVar49 = pcVar49 + 2;
    iVar6 = iVar6 + 1;
  }
LAB_00111f14:
  na = (secp256k1_scratch *)((ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  puStack_1ca8 = (undefined1 *)((ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x38);
  puStack_1ca0 = (undefined1 *)(asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff);
  psStack_1c98 = (secp256k1_gej *)(asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff);
  lVar11 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1678[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_9a8._0_8_ = 0xbb67ae856a09e667;
  auStack_9a8._8_8_ = 0xa54ff53a3c6ef372;
  auStack_9a8._16_8_ = 0x9b05688c510e527f;
  auStack_9a8._24_8_ = 0x5be0cd191f83d9ab;
  auStack_9a8._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_9a8,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_9a8,(uchar *)asStack_1678,0x10);
  puVar50 = auStack_ef8;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_9a8,puVar50);
  uVar1 = auStack_1bf8._64_8_;
  do {
    psVar21 = (secp256k1_fe *)0x0;
    uVar10 = 0;
    do {
      uVar10 = (ulong)puVar50[(long)psVar21] | uVar10 << 8;
      psVar21 = (secp256k1_fe *)((long)psVar21->n + 1);
    } while (psVar21 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar11] = uVar10;
    lVar11 = lVar11 + 1;
    puVar50 = puVar50 + 8;
  } while (lVar11 != 4);
  if (4 < (int)(uint)pFStack_1cd8) {
    lVar11 = strtol(*(char **)(auStack_1bf8._64_8_ + 0x18),(char **)0x0,0);
    num_cores = (uint32_t)lVar11;
    uVar10 = strtol(*(char **)(uVar1 + 0x20),(char **)0x0,0);
    this_core = (uint32_t)uVar10;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114a59:
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar10 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar42 = (secp256k1_context *)0xd0;
  psVar13 = (secp256k1_ge *)malloc(0xd0);
  if (psVar13 != (secp256k1_ge *)0x0) {
    psVar42 = (secp256k1_context *)0x130;
    psVar14 = (secp256k1_gej *)malloc(0x130);
    if (psVar14 != (secp256k1_gej *)0x0) {
      psVar42 = (secp256k1_context *)0x130;
      psVar40 = (secp256k1_gej *)malloc(0x130);
      if (psVar40 != (secp256k1_gej *)0x0) {
        secp256k1_scalar_verify(&secp256k1_scalar_one);
        asStack_1678[0].ecmult_gen_ctx.built = 7;
        secp256k1_scalar_verify((secp256k1_scalar *)asStack_1678);
        secp256k1_gej_set_infinity((secp256k1_gej *)auStack_9a8);
        uVar29 = 0xff;
        do {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
          secp256k1_scalar_verify((secp256k1_scalar *)asStack_1678);
          bVar52 = (7U >> (uVar29 & 0x1f) & 1) != 0;
          psVar21 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar21 >> 8),bVar52);
          if ((uVar29 < 0x20) && (bVar52)) {
            psVar21 = (secp256k1_fe *)0x0;
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,
                       &secp256k1_ge_const_g,(secp256k1_fe *)0x0);
          }
          bVar52 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar52);
        psVar42 = (secp256k1_context *)auStack_ef8;
        secp256k1_gej_double_var
                  ((secp256k1_gej *)psVar42,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
        iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar42,&secp256k1_ge_const_g);
        if (iVar6 != 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_ef8);
          lVar11 = -0x98;
          do {
            secp256k1_gej_add_var
                      ((secp256k1_gej *)auStack_ef8,(secp256k1_gej *)auStack_ef8,
                       (secp256k1_gej *)auStack_9a8,psVar21);
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0
                      );
            memcpy((void *)((long)psVar14[1].x.n + lVar11),(secp256k1_gej *)auStack_9a8,0x98);
            if (lVar11 != 0) {
              secp256k1_gej_double_var
                        ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,
                         (secp256k1_fe *)0x0);
            }
            lVar11 = lVar11 + 0x98;
          } while (lVar11 == 0);
          secp256k1_gej_neg(psVar40,(secp256k1_gej *)auStack_ef8);
          secp256k1_gej_add_var(psVar40 + 1,psVar40,psVar14,psVar21);
          lVar11 = 0;
          do {
            secp256k1_gej_verify((secp256k1_gej *)((long)(psVar40->x).n + lVar11));
            lVar11 = lVar11 + 0x98;
          } while (lVar11 == 0x98);
          psVar21 = &psVar40->z;
          lVar11 = -1;
          lVar30 = 0;
          psVar37 = psVar13;
          do {
            if ((int)psVar21[1].n[0] == 0) {
              if (lVar11 == -1) {
                uVar45 = psVar21->n[0];
                uVar5 = psVar21->n[1];
                auVar54 = *(undefined1 (*) [16])(psVar21->n + 2);
                uVar4 = *(undefined4 *)((long)psVar21->n + 0x24);
                iVar6 = psVar21->magnitude;
                iVar7 = psVar21->normalized;
                *(int *)((psVar37->x).n + 4) = (int)psVar21->n[4];
                *(undefined4 *)((long)(psVar37->x).n + 0x24) = uVar4;
                (psVar37->x).magnitude = iVar6;
                (psVar37->x).normalized = iVar7;
                *(undefined1 (*) [16])((psVar37->x).n + 2) = auVar54;
                (psVar37->x).n[0] = uVar45;
                (psVar37->x).n[1] = uVar5;
                lVar11 = lVar30;
              }
              else {
                secp256k1_fe_mul(&psVar37->x,&psVar13[lVar11].x,psVar21);
                lVar11 = lVar30;
              }
            }
            else {
              secp256k1_ge_set_infinity(psVar37);
            }
            lVar30 = lVar30 + 1;
            psVar37 = psVar37 + 1;
            psVar21 = (secp256k1_fe *)(psVar21[3].n + 1);
          } while (lVar30 == 1);
          if (lVar11 != -1) {
            psVar42 = (secp256k1_context *)auStack_ef8;
            secp256k1_fe_inv_var((secp256k1_fe *)psVar42,&psVar13[lVar11].x);
            if ((lVar11 != 0) && (psVar40->infinity == 0)) {
              psVar42 = (secp256k1_context *)auStack_ef8;
              secp256k1_fe_mul(&psVar13[lVar11].x,(secp256k1_fe *)psVar13,(secp256k1_fe *)psVar42);
              secp256k1_fe_mul((secp256k1_fe *)psVar42,(secp256k1_fe *)psVar42,&psVar40[lVar11].z);
              lVar11 = 0;
            }
            if (psVar40[lVar11].infinity != 0) goto LAB_00114acf;
            psVar21 = &psVar13[lVar11].x;
            *(undefined4 *)(psVar21->n + 4) = uStack_ed8;
            *(undefined4 *)((long)psVar21->n + 0x24) = uStack_ed4;
            *(int *)(psVar21->n + 4 + 1) = iStack_ed0;
            psVar21->normalized = iStack_ecc;
            *(undefined1 (*) [16])(psVar13[lVar11].x.n + 2) = auStack_ef8._16_16_;
            psVar13[lVar11].x.n[0] = auStack_ef8._0_8_;
            psVar13[lVar11].x.n[1] = auStack_ef8._8_8_;
            lVar11 = 0;
            a = psVar40;
            do {
              if (a->infinity == 0) {
                psVar37 = (secp256k1_ge *)((long)(psVar13->x).n + lVar11);
                secp256k1_ge_set_gej_zinv(psVar37,a,(secp256k1_fe *)psVar37);
              }
              lVar11 = lVar11 + 0x68;
              a = a + 1;
            } while (lVar11 == 0x68);
            lVar11 = 0;
            do {
              secp256k1_ge_verify((secp256k1_ge *)((long)(psVar13->x).n + lVar11));
              lVar11 = lVar11 + 0x68;
            } while (lVar11 == 0x68);
          }
          r_00 = secp256k1_ecmult_gen_prec_table;
          lVar11 = 0;
          do {
            psVar42 = (secp256k1_context *)((long)(psVar13->x).n + lVar11);
            psVar15 = psVar42;
            secp256k1_ge_verify((secp256k1_ge *)psVar42);
            if (*(int *)((long)(&psVar13->y + 1) + lVar11) != 0) goto LAB_00114a70;
            secp256k1_ge_to_storage(*r_00,(secp256k1_ge *)psVar42);
            lVar11 = lVar11 + 0x68;
            r_00 = (secp256k1_ge_storage (*) [2])((long)r_00 + 0x40);
          } while (lVar11 == 0x68);
          free(psVar40);
          free(psVar14);
          free(psVar13);
          secp256k1_gej_set_ge((secp256k1_gej *)auStack_9a8,&secp256k1_ge_const_g);
          secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_9a8,gen);
          iVar6 = 0x80;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0
                      );
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_9a8,gen_00);
          iVar6 = count;
joined_r0x0011246c:
          count = iVar6 + -1;
          if (iVar6 == 0) {
            testrand256((uchar *)asStack_1678);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,asStack_1678[0].ecmult_gen_ctx._0_8_ & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
                   (ulong)asStack_1678[0].ecmult_gen_ctx._0_8_ >> 0x38,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
                   asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
            puts("no problems found");
            return 0;
          }
          psVar15 = secp256k1_context_create(1);
          testrand256(abStack_1998);
          psVar42 = psVar15;
          iVar6 = secp256k1_context_randomize(psVar15,abStack_1998);
          if (iVar6 == 0) goto LAB_00114ad4;
          psStack_1cb8 = psVar15;
          auStack_1bf8._56_8_ = psVar15;
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_9a8);
          secp256k1_ge_set_gej((secp256k1_ge *)auStack_ef8,(secp256k1_gej *)auStack_9a8);
          iVar6 = 1;
          lVar11 = -0x4e0;
          psVar14 = (secp256k1_gej *)auStack_9a8;
          do {
            psVar40 = psVar14 + 1;
            secp256k1_gej_add_ge(psVar40,psVar14,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_9b0 + lVar11),psVar40);
            if (count != 0) {
              testutil_random_fe((secp256k1_fe *)asStack_1678);
              secp256k1_gej_rescale(psVar40,(secp256k1_fe *)asStack_1678);
            }
            auStack_1978._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1978);
            secp256k1_ecmult_gen
                      (&psStack_1cb8->ecmult_gen_ctx,(secp256k1_gej *)asStack_1678,
                       (secp256k1_scalar *)auStack_1978);
            psVar15 = (secp256k1_context *)auStack_11f8;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar15,(secp256k1_gej *)asStack_1678);
            if (*(int *)(auStack_9a8 + lVar11 + 0x58) != 0) goto LAB_00114a75;
            if (iStack_1198 != 0) goto LAB_00114a7a;
            psVar15 = (secp256k1_context *)auStack_11f8;
            iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar15,
                                       (secp256k1_fe *)(auStack_9b0 + lVar11));
            if (iVar7 == 0) goto LAB_00114a7f;
            psVar15 = (secp256k1_context *)auStack_11c8;
            iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar15,
                                       (secp256k1_fe *)(auStack_9a8 + lVar11 + 0x28));
            if (iVar7 == 0) goto LAB_00114a84;
            iVar6 = iVar6 + 1;
            lVar11 = lVar11 + 0x68;
            psVar14 = psVar40;
          } while (lVar11 != 0);
          uVar10 = 0;
          puVar35 = auStack_ef8;
          lVar11 = 0;
          do {
            psVar15 = (secp256k1_context *)(puVar35 + (uVar10 / 0xd) * -0x548);
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)asStack_1678,(secp256k1_ge *)(auStack_ef8 + lVar11));
            iVar6 = secp256k1_ge_eq_var((secp256k1_ge *)psVar15,(secp256k1_ge *)asStack_1678);
            if (iVar6 == 0) goto LAB_00114a89;
            lVar11 = lVar11 + 0x68;
            puVar35 = puVar35 + 0x3a8;
            uVar10 = uVar10 + 9;
          } while (lVar11 != 0x548);
          psVar42 = (secp256k1_context *)auStack_ef8;
          secp256k1_ge_verify((secp256k1_ge *)psVar42);
          if (aiStack_ea0[2] == 0) goto LAB_00114ad9;
          psVar42 = (secp256k1_context *)auStack_9a8;
          secp256k1_gej_verify((secp256k1_gej *)psVar42);
          if (auStack_9a8._144_4_ == 0) goto LAB_00114ade;
          lVar11 = 0xc;
          psVar42 = asStack_e90;
          a_00 = (secp256k1_context *)(auStack_9a8 + 0x98);
          do {
            psVar15 = psVar42;
            secp256k1_ge_verify((secp256k1_ge *)psVar42);
            if ((psVar42->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114a8e;
            psVar15 = a_00;
            secp256k1_gej_verify((secp256k1_gej *)a_00);
            if ((int)(a_00->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114a93;
            a_00 = (secp256k1_context *)&(a_00->ecmult_gen_ctx).proj_blind.magnitude;
            psVar42 = (secp256k1_context *)&(psVar42->ecmult_gen_ctx).ge_offset.infinity;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          puStack_1ca8 = auStack_ef8;
          uStack_1cd0 = 0;
          puStack_1ca0 = (undefined1 *)0x0;
          do {
            bVar52 = true;
            if ((ulong)num_cores != 1) {
              puStack_1ca0 = puStack_1ca0 + -0x18fc812e5f4bd725;
              bVar52 = (uint32_t)
                       (((ulong)puStack_1ca0 >> 0x20 ^ (ulong)puStack_1ca0 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar52) {
              lVar11 = uStack_1cd0 * 0x98;
              secp256k1_fe_inv((secp256k1_fe *)auStack_1978,
                               (secp256k1_fe *)(auStack_9a8 + lVar11 + 0x60));
              lVar30 = 0;
              puVar35 = puStack_1ca8;
              uVar10 = uStack_1cd0;
              do {
                psVar13 = (secp256k1_ge *)(puVar35 + (uVar10 / 0xd) * -0x548);
                psVar14 = (secp256k1_gej *)(auStack_9a8 + lVar30);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)asStack_1678,psVar14,
                           (secp256k1_gej *)(auStack_9a8 + lVar11),
                           (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
                iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1678,psVar13);
                if (iVar6 == 0) {
                  main_cold_64();
LAB_00114a4a:
                  main_cold_63();
LAB_00114a4f:
                  main_cold_62();
LAB_00114a54:
                  main_cold_9();
                  goto LAB_00114a59;
                }
                if (uStack_1cd0 != 0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)asStack_1678,psVar14,
                             (secp256k1_ge *)(auStack_ef8 + uStack_1cd0 * 0x68));
                  iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1678,psVar13);
                  if (iVar6 != 0) goto LAB_0011289f;
                  goto LAB_00114a54;
                }
LAB_0011289f:
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)asStack_1678,psVar14,
                           (secp256k1_ge *)(auStack_ef8 + uStack_1cd0 * 0x68),(secp256k1_fe *)0x0);
                iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1678,psVar13);
                if (iVar6 == 0) goto LAB_00114a4a;
                iStack_1198 = *(int *)(auStack_9a8 + lVar11 + 0x90);
                uStack_11d8 = *(uint64_t *)(auStack_9a8 + lVar11 + 0x20);
                uStack_11d0 = *(uint64_t *)(auStack_9a8 + lVar11 + 0x28);
                auStack_11e8._8_8_ = *(undefined8 *)(auStack_9a8 + lVar11 + 0x18);
                auStack_11e8._0_8_ = *(undefined8 *)(auStack_9a8 + lVar11 + 0x10);
                auStack_11f8._8_8_ = *(undefined8 *)(auStack_9a8 + lVar11 + 8);
                auStack_11f8._0_8_ = (((secp256k1_gej *)(auStack_9a8 + lVar11))->x).n[0];
                auStack_11c8._0_8_ = *(undefined8 *)(auStack_9a8 + lVar11 + 0x30);
                auStack_11c8._8_8_ = *(undefined8 *)(auStack_9a8 + lVar11 + 0x38);
                auStack_11c8._16_16_ = *(undefined1 (*) [16])(auStack_9a8 + lVar11 + 0x40);
                uStack_11a8 = *(undefined4 *)(auStack_9a8 + lVar11 + 0x50);
                uStack_11a4 = *(undefined4 *)(auStack_9a8 + lVar11 + 0x54);
                iStack_11a0 = *(int *)(auStack_9a8 + lVar11 + 0x58);
                iStack_119c = *(int *)(auStack_9a8 + lVar11 + 0x5c);
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)asStack_1678,psVar14,(secp256k1_ge *)auStack_11f8,
                           (secp256k1_fe *)auStack_1978);
                iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1678,psVar13);
                if (iVar6 == 0) goto LAB_00114a4f;
                lVar30 = lVar30 + 0x98;
                puVar35 = puVar35 + 0x68;
                uVar10 = uVar10 + 1;
              } while (lVar30 != 0x7b8);
            }
            uStack_1cd0 = uStack_1cd0 + 1;
            puStack_1ca8 = puStack_1ca8 + 0x68;
          } while (uStack_1cd0 != 0xd);
          uVar10 = 0;
          puVar35 = auStack_ef8;
          lVar11 = 0;
          do {
            psVar42 = asStack_1678;
            secp256k1_gej_double((secp256k1_gej *)psVar42,(secp256k1_gej *)(auStack_9a8 + lVar11));
            psVar15 = psVar42;
            iVar6 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)psVar42,
                               (secp256k1_ge *)(puVar35 + (uVar10 / 0xd) * -0x548));
            if (iVar6 == 0) goto LAB_00114a9d;
            secp256k1_gej_double_var
                      ((secp256k1_gej *)psVar42,(secp256k1_gej *)(auStack_9a8 + lVar11),
                       (secp256k1_fe *)0x0);
            iVar6 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)psVar42,
                               (secp256k1_ge *)(puVar35 + (uVar10 / 0xd) * -0x548));
            if (iVar6 == 0) goto LAB_00114aa2;
            lVar11 = lVar11 + 0x98;
            puVar35 = puVar35 + 0xd0;
            uVar10 = uVar10 + 2;
          } while (lVar11 != 0x7b8);
          lVar11 = 0x68;
          psVar13 = &sStack_a18;
          psVar14 = (secp256k1_gej *)(auStack_9a8 + 0x98);
          do {
            psVar42 = (secp256k1_context *)auStack_11f8;
            secp256k1_ge_neg((secp256k1_ge *)psVar42,(secp256k1_ge *)(auStack_ef8 + lVar11));
            iVar6 = secp256k1_ge_eq_var((secp256k1_ge *)psVar42,psVar13);
            if (iVar6 == 0) goto LAB_00114aa7;
            secp256k1_gej_neg((secp256k1_gej *)asStack_1678,psVar14);
            psVar42 = asStack_1678;
            iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1678,psVar13);
            if (iVar6 == 0) goto LAB_00114aac;
            lVar11 = lVar11 + 0x68;
            psVar14 = psVar14 + 1;
            psVar13 = psVar13 + -1;
          } while (lVar11 != 0x548);
          puVar35 = (undefined1 *)0x1;
          uStack_1cc8 = 0x68;
          psStack_1c98 = (secp256k1_gej *)0x0;
LAB_00112ac6:
          lVar11 = (long)puVar35 * 0x98;
          pFStack_1cd8 = (FILE *)0x0;
          puStack_1ca0 = auStack_ef8;
          puStack_1ca8 = puVar35;
          while( true ) {
            bVar52 = true;
            if ((ulong)num_cores != 1) {
              psStack_1c98 = (secp256k1_gej *)((long)psStack_1c98[-0x2a150f76858d35].y.n + 0x23);
              bVar52 = (uint32_t)
                       (((ulong)psStack_1c98 >> 0x20 ^ (ulong)psStack_1c98 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar52) break;
LAB_00112c17:
            pFStack_1cd8 = (FILE *)((long)&pFStack_1cd8->_flags + 1);
            puStack_1ca0 = puStack_1ca0 + 0x68;
            if ((int)pFStack_1cd8 == 0xd) goto code_r0x00112c31;
          }
          iVar6 = 0;
          puVar31 = puStack_1ca0;
          __stream = pFStack_1cd8;
          while( true ) {
            auStack_1bf8._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
            auStack_1c28._0_4_ = (int)pFStack_1cd8;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c28);
            auStack_1c68._8_8_ = auStack_11f8;
            auStack_1c68._0_8_ = auStack_1978;
            auStack_1c58._0_8_ = asStack_1678;
            na = (secp256k1_scratch *)auStack_1bf8;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1c68,(secp256k1_gej *)auStack_1b18,1,
                       (secp256k1_gej *)(auStack_9a8 + lVar11),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1c28);
            iVar7 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1b18,
                               (secp256k1_ge *)(puVar31 + ((ulong)__stream / 0xd) * -0x548));
            if (iVar7 == 0) break;
            iVar6 = iVar6 + 1;
            puVar31 = puVar31 + uStack_1cc8;
            __stream = (FILE *)((long)&__stream->_flags + (long)puStack_1ca8);
            puVar35 = puStack_1ca8;
            if (iVar6 == 0xd) goto LAB_00112c17;
          }
          main_cold_57();
LAB_00114a33:
          main_cold_1();
LAB_00111f07:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          goto LAB_00111f14;
        }
        goto LAB_00114aca;
      }
      goto LAB_00114aed;
    }
    goto LAB_00114ae8;
  }
LAB_00114ae3:
  main_cold_74();
LAB_00114ae8:
  main_cold_73();
LAB_00114aed:
  main_cold_72();
LAB_00114af2:
  main_cold_11();
LAB_00114af7:
  main_cold_12();
LAB_00114afc:
  main_cold_13();
LAB_00114b01:
  main_cold_14();
LAB_00114b06:
  main_cold_10();
LAB_00114b0b:
  main_cold_15();
LAB_00114b10:
  main_cold_16();
LAB_00114b15:
  main_cold_49();
LAB_00114b1a:
  main_cold_17();
LAB_00114b1f:
  main_cold_18();
LAB_00114b24:
  main_cold_19();
LAB_00114b29:
  main_cold_20();
LAB_00114b2e:
  main_cold_21();
LAB_00114b33:
  main_cold_48();
LAB_00114b38:
  main_cold_47();
LAB_00114b3d:
  main_cold_46();
LAB_00114b42:
  main_cold_45();
LAB_00114b47:
  main_cold_44();
LAB_00114b4c:
  main_cold_43();
LAB_00114b51:
  main_cold_22();
LAB_00114b56:
  main_cold_42();
LAB_00114b5b:
  main_cold_23();
LAB_00114b60:
  main_cold_41();
LAB_00114b65:
  main_cold_24();
LAB_00114b6a:
  main_cold_40();
LAB_00114b6f:
  main_cold_39();
LAB_00114b74:
  main_cold_25();
LAB_00114b79:
  main_cold_26();
LAB_00114b7e:
  main_cold_27();
LAB_00114b83:
  main_cold_28();
LAB_00114b88:
  main_cold_38();
LAB_00114b8d:
  main_cold_37();
LAB_00114b92:
  main_cold_36();
LAB_00114b97:
  main_cold_35();
LAB_00114b9c:
  main_cold_29();
LAB_00114ba1:
  main_cold_30();
LAB_00114ba6:
  main_cold_31();
LAB_00114bab:
  main_cold_32();
LAB_00114bb0:
  main_cold_34();
LAB_00114bb5:
  main_cold_33();
  lVar11 = 0;
  do {
    uVar45 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar33 = secp256k1_test_state[1] << 0x11;
    uVar24 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar10 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar24;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar10;
    secp256k1_test_state[3] = uVar10 << 0x2d | uVar10 >> 0x13;
    secp256k1_test_state[2] = uVar24 ^ uVar33;
    (psVar42->ecmult_gen_ctx).ge_offset.x.n[lVar11 + -1] = uVar45;
    lVar11 = lVar11 + 1;
  } while ((int)lVar11 != 4);
  return (int)secp256k1_test_state[0];
code_r0x00112c31:
  puVar35 = puVar35 + 1;
  uStack_1cc8 = uStack_1cc8 + 0x68;
  if (puVar35 == (undefined1 *)0xd) goto code_r0x00112c44;
  goto LAB_00112ac6;
code_r0x00112c44:
  lVar11 = 0;
  do {
    lVar30 = 0;
    do {
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        psStack_1c98 = (secp256k1_gej *)((long)psStack_1c98[-0x2a150f76858d35].y.n + 0x23);
        bVar52 = (uint32_t)
                 (((ulong)psStack_1c98 >> 0x20 ^ (ulong)psStack_1c98 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar52) {
        auStack_1c68._0_4_ = (int)lVar11;
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
        psVar13 = (secp256k1_ge *)(auStack_ef8 + lVar30 * 0x68);
        psVar42 = asStack_1678;
        secp256k1_ecmult_const((secp256k1_gej *)psVar42,psVar13,(secp256k1_scalar *)auStack_1c68);
        uVar29 = (int)lVar30 * (int)lVar11;
        psVar37 = (secp256k1_ge *)
                  (auStack_ef8 + (ulong)(uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc)) * 0x68);
        iVar6 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar42,psVar37);
        if (iVar6 == 0) goto LAB_00114ab1;
        if (lVar30 != 0 && lVar11 != 0) {
          psVar15 = (secp256k1_context *)auStack_1b18;
          psVar42 = psVar15;
          iVar6 = secp256k1_ecmult_const_xonly
                            ((secp256k1_fe *)psVar15,(secp256k1_fe *)psVar13,(secp256k1_fe *)0x0,
                             (secp256k1_scalar *)auStack_1c68,0);
          if (iVar6 == 0) goto LAB_00114ab6;
          iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar15,(secp256k1_fe *)psVar37);
          if (iVar6 == 0) goto LAB_00114abb;
          do {
            psVar15 = (secp256k1_context *)auStack_1978;
            testutil_random_fe((secp256k1_fe *)psVar15);
            secp256k1_fe_verify((secp256k1_fe *)psVar15);
            if (iStack_194c == 0) {
              main_cold_53();
              goto LAB_00114a70;
            }
          } while ((SUB168(auStack_1968 | auStack_1978,8) == 0 &&
                   SUB168(auStack_1968 | auStack_1978,0) == 0) &&
                   CONCAT44(auStack_1954,auStack_1958) == 0);
          secp256k1_fe_mul((secp256k1_fe *)auStack_11f8,(secp256k1_fe *)auStack_1978,
                           (secp256k1_fe *)psVar13);
          psVar42 = (secp256k1_context *)auStack_1b18;
          na = (secp256k1_scratch *)0x0;
          psVar15 = psVar42;
          iVar6 = secp256k1_ecmult_const_xonly
                            ((secp256k1_fe *)psVar42,(secp256k1_fe *)auStack_11f8,
                             (secp256k1_fe *)auStack_1978,(secp256k1_scalar *)auStack_1c68,0);
          if (iVar6 == 0) goto LAB_00114ac0;
          iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar42,(secp256k1_fe *)psVar37);
          if (iVar6 == 0) goto LAB_00114ac5;
        }
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0xd);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xd);
  psVar16 = (secp256k1_scratch *)malloc(0x1020);
  if (psVar16 == (secp256k1_scratch *)0x0) {
    (*(psStack_1cb8->error_callback).fn)("Out of memory",(psStack_1cb8->error_callback).data);
  }
  else {
    psVar16->magic[0] = '\0';
    psVar16->magic[1] = '\0';
    psVar16->magic[2] = '\0';
    psVar16->magic[3] = '\0';
    psVar16->magic[4] = '\0';
    psVar16->magic[5] = '\0';
    psVar16->magic[6] = '\0';
    psVar16->magic[7] = '\0';
    psVar16->data = (void *)0x0;
    psVar16->alloc_size = 0;
    psVar16->max_size = 0;
    builtin_memcpy(psVar16->magic,"scratch",8);
    psVar16->data = psVar16 + 1;
    psVar16->max_size = 0x1000;
  }
  auStack_1bf8._56_8_ = auStack_1bf8._56_8_ + 0xb0;
  auStack_1bf8._72_8_ = 0;
  uStack_1b60 = 0;
  psStack_1b40 = psVar16;
  do {
    auStack_1bf8._88_8_ = 0;
    do {
      auStack_1bf8._80_8_ = 0;
      do {
        uStack_1b70 = 0;
        do {
          uVar10 = (ulong)num_cores;
          bVar52 = true;
          if (uVar10 != 1) {
            uStack_1b60 = uStack_1b60 + 0xe7037ed1a0b428db;
            bVar52 = (uint32_t)((uStack_1b60 >> 0x20 ^ uStack_1b60 & 0xffffffff) * uVar10 >> 0x20)
                     == this_core;
          }
          if (bVar52) {
            puStack_1b50 = (uint64_t *)(auStack_ef8 + uStack_1b70 * 0x68);
            p_Stack_1b58 = (_func_void_char_ptr_void_ptr *)
                           (uStack_1b70 * auStack_1bf8._72_8_ + auStack_1bf8._80_8_);
            p_Var28 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              asStack_1678[0].ecmult_gen_ctx.built = (int)auStack_1bf8._72_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)asStack_1678);
              asStack_1678[0].ecmult_gen_ctx.scalar_offset = (int)auStack_1bf8._88_8_;
              secp256k1_scalar_verify(&asStack_1678[0].ecmult_gen_ctx.scalar_offset);
              auStack_1bf8._0_4_ = (int)auStack_1bf8._80_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
              puVar36 = puStack_1b50;
              psVar13 = &asStack_1678[0].ecmult_gen_ctx.ge_offset;
              for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
                (psVar13->x).n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar53 * -2 + 1;
                psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar53 * -2 + 1) * 8);
              }
              p_Stack_1b48 = p_Var28;
              puVar36 = (uint64_t *)(auStack_ef8 + (long)p_Var28 * 0x68);
              psVar21 = &asStack_1678[0].ecmult_gen_ctx.proj_blind;
              for (pvVar22 = (void *)0xd; pvVar22 != (void *)0x0;
                  pvVar22 = (void *)((long)pvVar22 + -1)) {
                psVar21->n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar53 * -2 + 1;
                psVar21 = (secp256k1_fe *)((long)psVar21 + ((ulong)bVar53 * -2 + 1) * 8);
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1978);
              if (psVar16 == (secp256k1_scratch *)0x0) {
LAB_001130d1:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)auStack_1978,(secp256k1_scalar *)auStack_1bf8,
                           (secp256k1_ecmult_multi_callback *)asStack_1678,pvVar22,(size_t)na);
              }
              else {
                sVar17 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1bf8._56_8_,psVar16,6);
                pvVar22 = (void *)0x1;
                na = (secp256k1_scratch *)&DAT_001227e8;
                uVar10 = 0;
                do {
                  if (pvVar22 == (void *)0xd) break;
                  if (pvVar22 < (void *)0xd) {
                    uVar24 = *(ulong *)na->magic;
                  }
                  else {
                    uVar24 = 0;
                  }
                  bVar52 = false;
                  uVar33 = 0x7f / (ulong)((int)pvVar22 + 1);
                  uVar44 = (0x98L << ((byte)pvVar22 & 0x3f)) + uVar33 * 8 + 0x118;
                  if (uVar44 <= sVar17) {
                    uVar33 = (sVar17 - uVar44) / (uVar33 * 8 + 0x108);
                    bVar52 = uVar24 <= uVar33;
                    if (!bVar52) {
                      uVar24 = uVar33;
                    }
                    if (uVar10 < uVar24) {
                      uVar10 = uVar24;
                    }
                  }
                  na = (secp256k1_scratch *)&na->data;
                  pvVar22 = (void *)((long)pvVar22 + 1);
                } while (bVar52);
                if (uVar10 == 0) goto LAB_001130d1;
                sVar17 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1bf8._56_8_,psVar16,5);
                pvVar22 = (void *)(sVar17 - 0xe18);
                bVar52 = pvVar22 < (void *)0xfffffffffffff8f4;
                if (sVar17 < 0x70c) {
                  bVar52 = uVar10 != 1;
                }
                uVar10 = (ulong)bVar52 + 1;
                if (sVar17 < 0x70c) goto LAB_001130d1;
                uStack_1b20 = (ulong)(pvVar22 < (void *)0xfffffffffffff8f4);
                uStack_1cd0 = 2;
                puStack_1b28 = (undefined1 *)(2 - uStack_1b20);
                puVar35 = (undefined1 *)0x0;
                uStack_1b38 = uVar10;
                do {
                  uVar24 = uVar10;
                  if (uStack_1cd0 < uVar10) {
                    uVar24 = uStack_1cd0;
                  }
                  lVar11 = (long)puVar35 << ((byte)uStack_1b20 & 0x3f);
                  auStack_1bf8._64_8_ = auStack_1bf8;
                  if (puVar35 != (undefined1 *)0x0) {
                    auStack_1bf8._64_8_ = (secp256k1_scalar *)0x0;
                  }
                  psVar14 = (secp256k1_gej *)0x0;
                  psVar34 = (secp256k1_scalar *)auStack_1bf8._64_8_;
                  do {
                    psVar25 = (secp256k1_scalar *)((ulong)psVar34 & 0xffffffff);
                    bVar2 = psVar16->magic[(long)(psVar14->x).n];
                    bVar3 = *(byte *)((long)psVar14[0x1e78].z.n + 1);
                    psVar34 = (secp256k1_scalar *)(ulong)((uint)bVar2 - (uint)bVar3);
                    if (bVar2 == bVar3) {
                      psVar34 = psVar25;
                    }
                    iVar6 = (int)psVar34;
                    if (bVar2 != bVar3) goto LAB_001131e5;
                    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
                  } while (psVar14 != (secp256k1_gej *)0x8);
                  iVar6 = 0;
LAB_001131e5:
                  if (iVar6 == 0) {
                    puStack_1ca0 = (undefined1 *)psVar16->alloc_size;
                  }
                  else {
                    (*(psStack_1cb8->error_callback).fn)
                              ("invalid scratch space",(psStack_1cb8->error_callback).data);
                    puStack_1ca0 = (undefined1 *)0x0;
                  }
                  puStack_1ca8 = puVar35;
                  secp256k1_gej_set_infinity((secp256k1_gej *)auStack_11f8);
                  uVar1 = auStack_1bf8._56_8_;
                  if (uStack_1cd0 == 0 && puVar35 != (undefined1 *)0x0) {
                    cVar47 = '\0';
                  }
                  else {
                    psStack_1c98 = (secp256k1_gej *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)auStack_1bf8._56_8_,psVar16,
                                              uVar24 * 0x98);
                    psStack_1b30 = (secp256k1_scratch *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)uVar1,psVar16,uVar24 * 4);
                    pvVar22 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,psVar16,uVar24 * 0xc0);
                    auStack_1c68._0_8_ = pvVar22;
                    pvVar18 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,psVar16,uVar24 * 0x1a0);
                    auStack_1c68._8_8_ = pvVar18;
                    pvVar19 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar1,psVar16,uVar24 * 0x410);
                    psVar16 = psStack_1b30;
                    auStack_1c58._0_8_ = pvVar19;
                    auVar54._0_4_ =
                         -(uint)((int)psStack_1c98 == 0 && (int)((ulong)psStack_1c98 >> 0x20) == 0);
                    auVar54._4_4_ =
                         -(uint)((int)psStack_1b30 == 0 && (int)((ulong)psStack_1b30 >> 0x20) == 0);
                    auVar54._8_4_ = -(uint)((int)pvVar22 == 0 && (int)((ulong)pvVar22 >> 0x20) == 0)
                    ;
                    auVar54._12_4_ =
                         -(uint)((int)pvVar18 == 0 && (int)((ulong)pvVar18 >> 0x20) == 0);
                    iVar6 = movmskps((int)psVar14,auVar54);
                    psVar14 = (secp256k1_gej *)
                              CONCAT71((int7)(CONCAT44((int)((ulong)psVar14 >> 0x20),iVar6) >> 8),
                                       iVar6 != 0 || pvVar19 == (void *)0x0);
                    uStack_1b64 = (int)psVar14;
                    if (iVar6 == 0 && pvVar19 != (void *)0x0) {
                      if (uStack_1cd0 != 0) {
                        psVar13 = &asStack_1678[0].ecmult_gen_ctx.ge_offset + lVar11;
                        sVar17 = 0;
                        psVar14 = psStack_1c98;
                        do {
                          *(undefined4 *)(psVar16->magic + sVar17 * 4) =
                               *(undefined4 *)
                                ((long)asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n +
                                sVar17 * 4 + lVar11 * 4 + -8);
                          psVar37 = psVar13;
                          psVar43 = (secp256k1_ge *)auStack_1b18;
                          for (lVar30 = 0xd; lVar30 != 0; lVar30 = lVar30 + -1) {
                            (psVar43->x).n[0] = (psVar37->x).n[0];
                            psVar37 = (secp256k1_ge *)((long)psVar37 + ((ulong)bVar53 * -2 + 1) * 8)
                            ;
                            psVar43 = (secp256k1_ge *)((long)psVar43 + (ulong)bVar53 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar14,(secp256k1_ge *)auStack_1b18);
                          sVar17 = sVar17 + 1;
                          psVar14 = psVar14 + 1;
                          psVar13 = psVar13 + 1;
                        } while (uVar24 != sVar17);
                      }
                      psVar14 = psStack_1c98;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1c68,
                                 (secp256k1_gej *)auStack_11f8,uVar24,psStack_1c98,
                                 (secp256k1_scalar *)psVar16,(secp256k1_scalar *)auStack_1bf8._64_8_
                                );
                      na = psVar16;
                    }
                    psVar16 = psStack_1b40;
                    secp256k1_scratch_apply_checkpoint
                              ((secp256k1_callback *)auStack_1bf8._56_8_,psStack_1b40,
                               (size_t)puStack_1ca0);
                    cVar47 = (char)uStack_1b64;
                    uVar10 = uStack_1b38;
                  }
                  puVar35 = puStack_1ca8;
                  if (cVar47 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_1978,(secp256k1_gej *)auStack_1978,
                               (secp256k1_gej *)auStack_11f8,&psVar14->x);
                    uStack_1cd0 = uStack_1cd0 - uVar24;
                  }
                  puVar35 = puVar35 + 1;
                } while (cVar47 == '\0' && puVar35 != puStack_1b28);
              }
              p_Var28 = p_Stack_1b48;
              uVar29 = (int)p_Stack_1b48 * auStack_1bf8._88_4_ + (int)p_Stack_1b58;
              psVar15 = (secp256k1_context *)auStack_1978;
              uVar29 = secp256k1_gej_eq_ge_var
                                 ((secp256k1_gej *)psVar15,
                                  (secp256k1_ge *)
                                  (auStack_ef8 +
                                  (ulong)(uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc)) * 0x68));
              uVar10 = (ulong)uVar29;
              if (uVar29 == 0) goto LAB_00114a98;
              p_Var28 = p_Var28 + 1;
            } while (p_Var28 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          uStack_1b70 = uStack_1b70 + 1;
        } while (uStack_1b70 != 0xd);
        auStack_1bf8._80_8_ = auStack_1bf8._80_8_ + 1;
      } while (auStack_1bf8._80_8_ != 0xd);
      auStack_1bf8._88_8_ = auStack_1bf8._88_8_ + 1;
    } while (auStack_1bf8._88_8_ != 0xd);
    auStack_1bf8._72_8_ = auStack_1bf8._72_8_ + 1;
  } while (auStack_1bf8._72_8_ != 0xd);
  if (psVar16 != (secp256k1_scratch *)0x0) {
    lVar11 = 0;
    do {
      bVar2 = psVar16->magic[lVar11];
      bVar3 = "scratch"[lVar11];
      psVar42 = (secp256k1_context *)(ulong)bVar3;
      uVar24 = (ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        uVar24 = uVar10;
      }
      iVar6 = (int)uVar24;
      if (bVar2 != bVar3) goto LAB_001134f6;
      lVar11 = lVar11 + 1;
      uVar10 = uVar24;
    } while (lVar11 != 8);
    iVar6 = 0;
LAB_001134f6:
    if (iVar6 == 0) {
      if (psVar16->alloc_size != 0) goto LAB_00114b06;
      psVar16->magic[0] = '\0';
      psVar16->magic[1] = '\0';
      psVar16->magic[2] = '\0';
      psVar16->magic[3] = '\0';
      psVar16->magic[4] = '\0';
      psVar16->magic[5] = '\0';
      psVar16->magic[6] = '\0';
      psVar16->magic[7] = '\0';
      free(psVar16);
      na = psVar16;
    }
    else {
      (*(psStack_1cb8->error_callback).fn)
                ("invalid scratch space",(psStack_1cb8->error_callback).data);
      na = psVar16;
    }
  }
  iVar6 = 1;
  pFStack_1cd8 = (FILE *)0x0;
  do {
    iVar7 = 1;
    do {
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        pFStack_1cd8 = (FILE *)((long)pFStack_1cd8 + 0xe7037ed1a0b428db);
        bVar52 = (uint32_t)
                 (((ulong)pFStack_1cd8 >> 0x20 ^ (ulong)pFStack_1cd8 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar52) {
        auStack_1b18._0_4_ = 1;
        iVar26 = 1;
        do {
          auStack_1bf8._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
          auStack_1c68._0_4_ = iVar7;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
          auStack_11f8 = (undefined1  [16])0x0;
          auStack_11e8._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_11e8[0xf] = (char)iVar7;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
          auStack_1978 = (undefined1  [16])0x0;
          auStack_1968._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1968[0xf] = (char)iVar6;
          psVar42 = psStack_1cb8;
          iVar8 = secp256k1_ecdsa_sign
                            (psStack_1cb8,(secp256k1_ecdsa_signature *)asStack_1678,auStack_1978,
                             auStack_11f8,secp256k1_nonce_function_smallint,auStack_1b18);
          if (iVar8 != 1) goto LAB_00114af2;
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1c28,(uchar *)asStack_1678,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1b98,
                     (uchar *)(asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          psVar42 = (secp256k1_context *)auStack_1c88;
          r_from_k((secp256k1_scalar *)psVar42,(secp256k1_ge *)auStack_ef8,auStack_1b18._0_4_,
                   (int *)0x0);
          if (auStack_1c28._0_4_ != auStack_1c88._0_4_) goto LAB_00114af7;
          uVar4 = auStack_1b18._0_4_;
          uVar32 = auStack_1b98._0_4_ * auStack_1b18._0_4_;
          uVar29 = auStack_1c28._0_4_ * iVar7 + iVar6;
          na = (secp256k1_scratch *)(ulong)((uVar29 / 0xd) * 3);
          iVar8 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
          if (uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc) != iVar8) {
            uVar29 = (0xd - auStack_1b98._0_4_) * auStack_1b18._0_4_;
            psVar42 = (secp256k1_context *)(ulong)((uVar29 / 0xd) * 3);
            if (uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar8) goto LAB_00114afc;
          }
          if ((int)auStack_1b18._0_4_ < iVar26) break;
          iVar26 = auStack_1b18._0_4_ + 1;
          auStack_1b18._0_4_ = iVar26;
        } while ((int)uVar4 < 0xc);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0xd);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0xd);
  uStack_1cd0._0_4_ = 1;
  uStack_1cc8 = 0;
  do {
    iVar6 = 1;
    do {
      iVar7 = 1;
      do {
        puVar35 = (undefined1 *)0x1;
        do {
          bVar52 = true;
          if ((ulong)num_cores != 1) {
            uStack_1cc8 = uStack_1cc8 + 0xe7037ed1a0b428db;
            bVar52 = (uint32_t)
                     ((uStack_1cc8 >> 0x20 ^ uStack_1cc8 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar52) {
            auStack_1b98._0_4_ = (uint)uStack_1cd0;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
            auStack_1c28._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c28);
            auStack_1bf8._0_4_ = iVar7;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
            auStack_1c68._0_4_ = (int)puVar35;
            puStack_1ca8 = puVar35;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
            uVar29 = 0;
            iVar26 = 0;
            do {
              r_from_k((secp256k1_scalar *)asStack_1678,(secp256k1_ge *)auStack_ef8,iVar26,
                       (int *)0x0);
              if (iVar6 == asStack_1678[0].ecmult_gen_ctx.built) {
                auStack_1c88._0_4_ = iVar26;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c88);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1c88,(secp256k1_scalar *)auStack_1c88,
                           (secp256k1_scalar *)auStack_1b98);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1cbc,(secp256k1_scalar *)auStack_1c28,
                           (secp256k1_scalar *)auStack_1c68);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1cbc,(secp256k1_scalar *)auStack_1cbc,
                           (secp256k1_scalar *)auStack_1bf8);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c88);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1cbc);
                uVar29 = uVar29 | (uchar  [4])auStack_1c88._0_4_ == auStack_1cbc;
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 != 0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
            secp256k1_ecdsa_signature_save
                      ((secp256k1_ecdsa_signature *)auStack_11f8,(secp256k1_scalar *)auStack_1c28,
                       (secp256k1_scalar *)auStack_1b98);
            puVar35 = puStack_1ca8;
            puVar38 = (undefined8 *)(auStack_ef8 + (long)puStack_1ca8 * 0x68);
            psVar42 = asStack_1678;
            for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
              uVar1 = *puVar38;
              (psVar42->ecmult_gen_ctx).built = (int)uVar1;
              (psVar42->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar38 = puVar38 + (ulong)bVar53 * -2 + 1;
              psVar42 = (secp256k1_context *)((long)psVar42 + (ulong)bVar53 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_1978,(secp256k1_ge *)asStack_1678);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
            auStack_1b18 = (undefined1  [16])0x0;
            auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b08[0xf] = (char)iVar7;
            psVar42 = psStack_1cb8;
            uVar32 = secp256k1_ecdsa_verify
                               (psStack_1cb8,(secp256k1_ecdsa_signature *)auStack_11f8,auStack_1b18,
                                (secp256k1_pubkey *)auStack_1978);
            if (((uint)uStack_1cd0 < 7 & uVar29) != uVar32) goto LAB_00114b01;
          }
          puVar35 = puVar35 + 1;
        } while (puVar35 != (undefined1 *)0xd);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0xd);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    uStack_1cd0._0_4_ = (uint)uStack_1cd0 + 1;
  } while ((uint)uStack_1cd0 != 0xd);
  iVar6 = 1;
  uStack_1cc8 = 0;
  do {
    iVar7 = 1;
    do {
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        uStack_1cc8 = uStack_1cc8 + 0xe7037ed1a0b428db;
        bVar52 = (uint32_t)
                 ((uStack_1cc8 >> 0x20 ^ uStack_1cc8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar52) {
        auStack_1bf8._0_4_ = 1;
        iVar26 = 1;
        do {
          auStack_1b98._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
          auStack_1c28._0_4_ = iVar7;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c28);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c28);
          auStack_1b18 = (undefined1  [16])0x0;
          auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1b08[0xf] = (char)iVar7;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
          auStack_1c68 = (undefined1  [16])0x0;
          auStack_1c58._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1c58[0xf] = (char)iVar6;
          secp256k1_ecdsa_sign_recoverable
                    (psStack_1cb8,(secp256k1_ecdsa_recoverable_signature *)asStack_1678,auStack_1c68
                     ,auStack_1b18,secp256k1_nonce_function_smallint,auStack_1bf8);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1c88,(uchar *)asStack_1678,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1cbc,
                     (uchar *)(asStack_1678[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          bVar2 = (byte)asStack_1678[0].ecmult_gen_ctx.ge_offset.y.n[1];
          psVar42 = (secp256k1_context *)auStack_1cac;
          r_from_k((secp256k1_scalar *)psVar42,(secp256k1_ge *)auStack_ef8,auStack_1bf8._0_4_,
                   (int *)&sStack_1c8c);
          auVar27 = auStack_1cbc;
          if ((undefined1  [4])auStack_1c88._0_4_ != auStack_1cac) goto LAB_00114b0b;
          lVar11 = (long)(int)auStack_1bf8._0_4_;
          uVar29 = (int)auStack_1cbc * auStack_1bf8._0_4_;
          uVar32 = auStack_1c88._0_4_ * iVar7 + iVar6;
          iVar8 = uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc);
          if ((uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar8) &&
             (uVar29 = (0xd - (int)auStack_1cbc) * auStack_1bf8._0_4_,
             uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar8)) goto LAB_00114b10;
          uVar29 = (uint)(sStack_1c8c != 0) * 2;
          lVar30 = lVar11 * 0x68;
          auStack_1958 = *(uchar (*) [4])(auStack_ea8 + lVar30);
          auStack_1954 = *(uchar (*) [4])(auStack_ea4 + lVar30);
          iStack_1950 = aiStack_ea0[lVar11 * 0x1a];
          iStack_194c = aiStack_ea0[lVar11 * 0x1a + 1];
          auStack_1978._8_8_ = asStack_ec0[lVar11 * 0xd];
          auStack_1978._0_8_ = *(undefined8 *)(auStack_ec8 + lVar30);
          auStack_1968._8_8_ = *(undefined8 *)(auStack_ea8 + lVar30 + -8);
          auStack_1968._0_8_ = asStack_ec0[lVar11 * 0xd + 1];
          psVar42 = (secp256k1_context *)auStack_1978;
          secp256k1_fe_normalize((secp256k1_fe *)psVar42);
          uVar32 = (int)auVar27 * auStack_1bf8._0_4_;
          secp256k1_fe_verify((secp256k1_fe *)psVar42);
          if (uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc) == iVar8) {
            if (iStack_194c == 0) goto LAB_00114b15;
            uVar29 = auStack_1978._0_4_ & 1 | uVar29;
          }
          else {
            if (iStack_194c == 0) goto LAB_00114b1a;
            uVar29 = (auStack_1978._0_4_ & 1 | uVar29) ^ 1;
          }
          if (uVar29 != bVar2) goto LAB_00114b1f;
          secp256k1_ecdsa_recoverable_signature_convert
                    (psStack_1cb8,(secp256k1_ecdsa_signature *)auStack_11f8,
                     (secp256k1_ecdsa_recoverable_signature *)asStack_1678);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1c88,(uchar *)auStack_11f8,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1cbc,(uchar *)&uStack_11d8,(int *)0x0);
          psVar42 = (secp256k1_context *)auStack_1cac;
          r_from_k((secp256k1_scalar *)psVar42,(secp256k1_ge *)auStack_ef8,auStack_1bf8._0_4_,
                   (int *)0x0);
          if ((undefined1  [4])auStack_1c88._0_4_ != auStack_1cac) goto LAB_00114b24;
          uVar4 = auStack_1bf8._0_4_;
          uVar32 = (int)auStack_1cbc * auStack_1bf8._0_4_;
          uVar29 = auStack_1c88._0_4_ * iVar7 + iVar6;
          na = (secp256k1_scratch *)(ulong)((uVar29 / 0xd) * 3);
          iVar8 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
          if (uVar32 - (uVar32 / 0xd + (uVar32 / 0xd) * 0xc) != iVar8) {
            uVar29 = (0xd - (int)auStack_1cbc) * auStack_1bf8._0_4_;
            psVar42 = (secp256k1_context *)(ulong)((uVar29 / 0xd) * 3);
            if (uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar8) goto LAB_00114b29;
          }
          if ((int)auStack_1bf8._0_4_ < iVar26) break;
          iVar26 = auStack_1bf8._0_4_ + 1;
          auStack_1bf8._0_4_ = iVar26;
        } while ((int)uVar4 < 0xc);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0xd);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0xd);
  pFStack_1cd8._0_4_ = 1;
  uStack_1cd0 = 0;
  do {
    iVar6 = 1;
    do {
      iVar7 = 1;
      do {
        lVar11 = 1;
        do {
          bVar52 = true;
          if ((ulong)num_cores != 1) {
            uStack_1cd0 = uStack_1cd0 + 0xe7037ed1a0b428db;
            bVar52 = (uint32_t)
                     ((uStack_1cd0 >> 0x20 ^ uStack_1cd0 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar52) {
            auStack_1c88._0_4_ = (uint)pFStack_1cd8;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c88);
            auStack_1b98._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
            auStack_1c28._0_4_ = iVar7;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c28);
            auStack_1bf8._0_4_ = (int)lVar11;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf8);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c28);
            auStack_1c68 = (undefined1  [16])0x0;
            auStack_1c58._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1c58[0xf] = (char)iVar7;
            uVar29 = 0;
            auVar27[0] = '\0';
            auVar27[1] = '\0';
            auVar27[2] = '\0';
            auVar27[3] = '\0';
            do {
              r_from_k((secp256k1_scalar *)asStack_1678,(secp256k1_ge *)auStack_ef8,(int)auVar27,
                       (int *)0x0);
              if (iVar6 == asStack_1678[0].ecmult_gen_ctx.built) {
                auStack_1cbc = auVar27;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1cbc);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1cbc,(secp256k1_scalar *)auStack_1cbc,
                           (secp256k1_scalar *)auStack_1c88);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1cac,(secp256k1_scalar *)auStack_1b98,
                           (secp256k1_scalar *)auStack_1bf8);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1cac,(secp256k1_scalar *)auStack_1cac,
                           (secp256k1_scalar *)auStack_1c28);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1cbc);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1cac);
                uVar29 = uVar29 | auStack_1cbc == (uchar  [4])auStack_1cac;
              }
              auVar27 = (uchar  [4])((int)auVar27 + 1);
            } while (auVar27 != (uchar  [4])0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c88);
            secp256k1_ecdsa_recoverable_signature_save
                      ((secp256k1_ecdsa_recoverable_signature *)auStack_11f8,
                       (secp256k1_scalar *)auStack_1b98,(secp256k1_scalar *)auStack_1c88,0);
            psVar42 = psStack_1cb8;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psStack_1cb8,(secp256k1_ecdsa_signature *)auStack_1978,
                       (secp256k1_ecdsa_recoverable_signature *)auStack_11f8);
            puVar38 = (undefined8 *)(auStack_ef8 + lVar11 * 0x68);
            psVar15 = asStack_1678;
            for (lVar30 = 0xd; lVar30 != 0; lVar30 = lVar30 + -1) {
              uVar1 = *puVar38;
              (psVar15->ecmult_gen_ctx).built = (int)uVar1;
              (psVar15->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar38 = puVar38 + (ulong)bVar53 * -2 + 1;
              psVar15 = (secp256k1_context *)((long)psVar15 + (ulong)bVar53 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_1b18,(secp256k1_ge *)asStack_1678);
            uVar32 = secp256k1_ecdsa_verify
                               (psVar42,(secp256k1_ecdsa_signature *)auStack_1978,auStack_1c68,
                                (secp256k1_pubkey *)auStack_1b18);
            if (((uint)pFStack_1cd8 < 7 & uVar29) != uVar32) goto LAB_00114b2e;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0xd);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0xd);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    pFStack_1cd8._0_4_ = (uint)pFStack_1cd8 + 1;
  } while ((uint)pFStack_1cd8 != 0xd);
  pFStack_1cd8 = (FILE *)0x1;
  puVar35 = auStack_19b8;
  puVar31 = auStack_1b18;
  do {
    auStack_1b98._0_4_ = (int)pFStack_1cd8;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b98);
    auStack_1c28 = (undefined1  [16])0x0;
    auStack_1c18._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1c18[0xf] = (char)pFStack_1cd8;
    lVar11 = (long)pFStack_1cd8 - 1;
    keypair = (secp256k1_keypair *)
              ((long)(&asStack_1678[0].ecmult_gen_ctx.ge_offset + -1) + (long)pFStack_1cd8 * 0x60);
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_keypair_create(psStack_1cb8,keypair,auStack_1c28);
    if (iVar6 == 0) goto LAB_00114b33;
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_ec_pubkey_create
                      (psStack_1cb8,(secp256k1_pubkey *)(auStack_11f8 + lVar11 * 0x40),auStack_1c28)
    ;
    if (iVar6 == 0) goto LAB_00114b38;
    psVar51 = (secp256k1_xonly_pubkey *)(auStack_1978 + lVar11 * 0x40);
    pk_parity = (uchar (*) [4])(auStack_1c68 + lVar11 * 4);
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_keypair_xonly_pub(psStack_1cb8,psVar51,(int *)pk_parity,keypair);
    if (iVar6 == 0) goto LAB_00114b3d;
    puVar50 = auStack_1b18 + lVar11 * 0x20;
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_xonly_pubkey_serialize(psStack_1cb8,puVar50,psVar51);
    if (iVar6 == 0) goto LAB_00114b42;
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_xonly_pubkey_parse(psStack_1cb8,psVar51,puVar50);
    if (iVar6 == 0) goto LAB_00114b47;
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_xonly_pubkey_serialize(psStack_1cb8,auStack_1c28,psVar51);
    if (iVar6 == 0) goto LAB_00114b4c;
    lVar30 = 0;
    do {
      bVar2 = auStack_1c28[lVar30];
      psVar42 = (secp256k1_context *)(ulong)bVar2;
      iVar6 = (uint)(byte)puVar31[lVar30] - (uint)bVar2;
      if (puVar31[lVar30] != bVar2) goto LAB_00114123;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x20);
    iVar6 = 0;
LAB_00114123:
    if (iVar6 != 0) goto LAB_00114b51;
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_xonly_pubkey_from_pubkey
                      (psStack_1cb8,psVar51,(int *)auStack_1c88,
                       (secp256k1_pubkey *)(auStack_11f8 + lVar11 * 0x40));
    if (iVar6 == 0) goto LAB_00114b56;
    if ((uchar  [4])auStack_1c88._0_4_ != *pk_parity) goto LAB_00114b5b;
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_xonly_pubkey_serialize(psStack_1cb8,auStack_1c28,psVar51);
    if (iVar6 == 0) goto LAB_00114b60;
    lVar11 = 0;
    do {
      bVar2 = auStack_1c28[lVar11];
      psVar42 = (secp256k1_context *)(ulong)bVar2;
      iVar6 = (uint)(byte)puVar31[lVar11] - (uint)bVar2;
      if (puVar31[lVar11] != bVar2) goto LAB_0011419e;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    iVar6 = 0;
LAB_0011419e:
    if (iVar6 != 0) goto LAB_00114b65;
    psVar42 = (secp256k1_context *)auStack_1bf8;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar42,puVar50);
    auStack_1bf8._40_8_ = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)psVar42);
    lVar11 = (long)pFStack_1cd8 * 0x68;
    iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar42,(secp256k1_fe *)(auStack_ef8 + lVar11));
    if (iVar6 == 0) goto LAB_00114b6a;
    auStack_1bf8._0_8_ = *(uchar (*) [8])(auStack_ec8 + lVar11);
    auStack_1bf8._8_8_ = asStack_ec0[(long)pFStack_1cd8 * 0xd];
    auStack_1bf8._16_8_ = asStack_ec0[(long)pFStack_1cd8 * 0xd + 1];
    auStack_1bf8._24_8_ = *(undefined8 *)(auStack_ea8 + lVar11 + -8);
    auStack_1bf8._32_4_ = *(undefined4 *)(auStack_ea8 + lVar11);
    auStack_1bf8._36_4_ = *(undefined4 *)(auStack_ea4 + lVar11);
    auStack_1bf8._44_4_ = aiStack_ea0[(long)pFStack_1cd8 * 0x1a + 1];
    auStack_1bf8._40_4_ = aiStack_ea0[(long)pFStack_1cd8 * 0x1a];
    psVar42 = (secp256k1_context *)auStack_1bf8;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar42);
    secp256k1_fe_verify((secp256k1_fe *)psVar42);
    if (auStack_1bf8._44_4_ == 0) goto LAB_00114b6f;
    if ((uchar  [4])(auStack_1bf8._0_4_ & 1) != *pk_parity) goto LAB_00114b74;
    if (6 < pFStack_1cd8) {
      lVar11 = 0;
      psVar15 = extraout_RDX;
      do {
        psVar42 = (secp256k1_context *)((ulong)psVar15 & 0xffffffff);
        bVar2 = puVar31[lVar11];
        na = (secp256k1_scratch *)(ulong)bVar2;
        bVar3 = puVar35[lVar11];
        psVar15 = (secp256k1_context *)(ulong)((uint)bVar2 - (uint)bVar3);
        if (bVar2 == bVar3) {
          psVar15 = psVar42;
        }
        iVar6 = (int)psVar15;
        if (bVar2 != bVar3) goto LAB_0011428f;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      iVar6 = 0;
LAB_0011428f:
      if (iVar6 != 0) goto LAB_00114b79;
      if (*pk_parity != (uchar  [4])(1U - *(int *)(auStack_1c68 + (0xc - (long)pFStack_1cd8) * 4)))
      goto LAB_00114b7e;
    }
    pFStack_1cd8 = (FILE *)((long)pFStack_1cd8 + 1);
    puVar31 = puVar31 + 0x20;
    puVar35 = puVar35 + -0x20;
  } while (pFStack_1cd8 != (FILE *)0xd);
  lVar11 = 0;
  do {
    psVar42 = psStack_1cb8;
    iVar6 = secp256k1_xonly_pubkey_parse
                      (psStack_1cb8,(secp256k1_xonly_pubkey *)asStack_1678,
                       invalid_pubkey_bytes[0] + lVar11);
    if (iVar6 != 0) goto LAB_00114b83;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0xe0);
  iVar6 = 1;
  psVar15 = asStack_1678;
  psVar51 = (secp256k1_xonly_pubkey *)auStack_11f8;
  puVar50 = auStack_1978;
  lVar11 = 0;
  do {
    auStack_1c68._0_4_ = iVar6;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
    auStack_1b18 = (undefined1  [16])0x0;
    auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1b08[0xf] = (char)iVar6;
    psVar42 = psStack_1cb8;
    iVar7 = secp256k1_keypair_create(psStack_1cb8,(secp256k1_keypair *)psVar15,auStack_1b18);
    if (iVar7 == 0) goto LAB_00114b88;
    psVar42 = psStack_1cb8;
    iVar7 = secp256k1_keypair_xonly_pub
                      (psStack_1cb8,psVar51,(int *)(auStack_1bf8 + lVar11),
                       (secp256k1_keypair *)psVar15);
    if (iVar7 == 0) goto LAB_00114b8d;
    psVar42 = psStack_1cb8;
    iVar7 = secp256k1_xonly_pubkey_serialize(psStack_1cb8,puVar50,psVar51);
    if (iVar7 == 0) goto LAB_00114b92;
    lVar11 = lVar11 + 4;
    puVar50 = puVar50 + 0x20;
    psVar51 = psVar51 + 1;
    psVar15 = (secp256k1_context *)&(psVar15->ecmult_gen_ctx).ge_offset.y.magnitude;
    iVar6 = iVar6 + 1;
  } while (lVar11 != 0x30);
  auStack_1c88._16_8_ = (uchar *)0x0;
  auStack_1c88._0_8_ = 0x8cb36fda;
  auStack_1c88._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  uStack_1cc8 = 1;
  uStack_1cd0 = 0;
  do {
    iVar6 = 0xd - (int)uStack_1cc8;
    if ((&iStack_1bfc)[uStack_1cc8] == 0) {
      iVar6 = (int)uStack_1cc8;
    }
    auStack_1cbc[0] = '\x01';
    auStack_1cbc[1] = '\0';
    auStack_1cbc[2] = '\0';
    auStack_1cbc[3] = '\0';
    do {
      auStack_1c48 = (undefined1  [16])0x0;
      auStack_1c58 = (undefined1  [16])0x0;
      auStack_1c68 = (undefined1  [16])0x0;
      uStack_1c38 = 0;
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        uStack_1cd0 = uStack_1cd0 + 0xe7037ed1a0b428db;
        bVar52 = (uint32_t)
                 ((uStack_1cd0 >> 0x20 ^ uStack_1cd0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar52) {
        auStack_1c88._8_8_ = secp256k1_hardened_nonce_function_smallint;
        auStack_1c88._16_8_ = auStack_1cbc;
        auVar27 = (uchar  [4])(0xd - (int)auStack_1cbc);
        if ((&iStack_1bfc)[(int)auStack_1cbc] == 0) {
          auVar27 = auStack_1cbc;
        }
        iVar7 = 0;
        do {
          testrand256(auStack_1c28);
          na = (secp256k1_scratch *)(auStack_1978 + (uStack_1cc8 + -1) * 0x20);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1cac,abStack_1998 + (long)(int)auStack_1cbc * 0x20,
                     auStack_1c28,0x20,(uchar *)(auStack_1978 + (uStack_1cc8 + -1) * 0x20));
          uVar10 = (ulong)(uint)auStack_1cac;
          if (*(int *)(auStack_1c68 + uVar10 * 4) == 0) {
            uVar29 = (int)auStack_1cac * iVar6 + (int)auVar27;
            sVar48 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
            sStack_1c8c = sVar48;
            secp256k1_scalar_verify(&sStack_1c8c);
            auStack_1b98 = (undefined1  [16])0x0;
            auStack_1b88._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b88[0xf] = (char)sVar48;
            psVar42 = psStack_1cb8;
            iVar26 = secp256k1_schnorrsig_sign_custom
                               (psStack_1cb8,auStack_1b18,auStack_1c28,0x20,
                                (secp256k1_keypair *)
                                ((long)(&asStack_1678[0].ecmult_gen_ctx.ge_offset + -1) +
                                uStack_1cc8 * 0x60),(secp256k1_schnorrsig_extraparams *)auStack_1c88
                               );
            if (iVar26 == 0) goto LAB_00114b97;
            pbVar23 = abStack_1998;
            pbVar20 = pbVar23 + (long)(int)auStack_1cbc * 0x20;
            lVar11 = 0;
            do {
              pbVar39 = (byte *)((ulong)pbVar23 & 0xffffffff);
              bVar2 = auStack_1b18[lVar11];
              psVar42 = (secp256k1_context *)(ulong)bVar2;
              bVar3 = pbVar20[lVar11];
              na = (secp256k1_scratch *)(ulong)bVar3;
              pbVar23 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar23 = pbVar39;
              }
              iVar26 = (int)pbVar23;
              if (bVar2 != bVar3) goto LAB_001145da;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x20);
            iVar26 = 0;
LAB_001145da:
            if (iVar26 != 0) goto LAB_00114b9c;
            lVar11 = 0;
            do {
              pbVar23 = (byte *)((ulong)pbVar20 & 0xffffffff);
              bVar2 = auStack_1af8[lVar11];
              bVar3 = auStack_1b98[lVar11];
              psVar42 = (secp256k1_context *)(ulong)bVar3;
              pbVar20 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar20 = pbVar23;
              }
              iVar26 = (int)pbVar20;
              if (bVar2 != bVar3) goto LAB_0011460d;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x20);
            iVar26 = 0;
LAB_0011460d:
            if (iVar26 != 0) goto LAB_00114ba1;
            *(undefined4 *)(auStack_1c68 + uVar10 * 4) = 1;
            iVar7 = iVar7 + 1;
          }
        } while (iVar7 < 0xd);
      }
      auVar27 = (uchar  [4])((int)auStack_1cbc + 1);
      bVar52 = (int)auStack_1cbc < 0xc;
      auStack_1cbc = auVar27;
    } while (bVar52);
    uStack_1cc8 = uStack_1cc8 + 1;
  } while (uStack_1cc8 != 0xd);
  puStack_1ca8 = (undefined1 *)0x1;
  puStack_1ca0 = (undefined1 *)0x0;
  do {
    puVar35 = puStack_1ca8 + -1;
    lVar11 = (long)puVar35 * 0x20;
    auStack_1c18 = *(undefined1 (*) [16])(auStack_1968 + lVar11);
    iVar6 = 0xd - (int)puStack_1ca8;
    if ((&iStack_1bfc)[(long)puStack_1ca8] == 0) {
      iVar6 = (int)puStack_1ca8;
    }
    psStack_1c98 = (secp256k1_gej *)CONCAT44(psStack_1c98._4_4_,iVar6);
    auStack_1c28._8_8_ = *(undefined8 *)(auStack_1978 + lVar11 + 8);
    auStack_1c28._0_8_ = *(undefined8 *)(auStack_1978 + lVar11);
    uStack_1cc8 = 1;
    do {
      uVar1 = auStack_1bf8._64_8_;
      auStack_1c48 = (undefined1  [16])0x0;
      auStack_1c58 = (undefined1  [16])0x0;
      auStack_1c68 = (undefined1  [16])0x0;
      uStack_1c38 = 0;
      bVar52 = true;
      if ((ulong)num_cores != 1) {
        puStack_1ca0 = puStack_1ca0 + -0x18fc812e5f4bd725;
        bVar52 = (uint32_t)
                 (((ulong)puStack_1ca0 >> 0x20 ^ (ulong)puStack_1ca0 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar52) {
        iVar6 = (int)uStack_1cc8;
        if (uStack_1cc8 < 7) {
          lVar11 = (uStack_1cc8 - 1) * 0x20;
          auStack_1b08 = *(undefined1 (*) [16])(auStack_1968 + lVar11);
          auStack_1b18._8_8_ = *(undefined8 *)(auStack_1978 + lVar11 + 8);
          auStack_1b18._0_8_ = *(undefined8 *)(auStack_1978 + lVar11);
          iVar7 = 0xd - iVar6;
          if ((&iStack_1bfc)[uStack_1cc8] == 0) {
            iVar7 = iVar6;
          }
        }
        else {
          auStack_1b18 = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar6 - 7U];
          auStack_1b08 = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar6 - 7U] + 0x10);
          iVar7 = -1;
        }
        auStack_1bf8._65_3_ = 0;
        auStack_1bf8[0x40] = iVar7 != -1;
        auStack_1bf8._68_4_ = SUB84(uVar1,4);
        iVar6 = 0;
        do {
          testrand256(auStack_1b98);
          na = (secp256k1_scratch *)auStack_1c28;
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1c88,auStack_1b18,auStack_1b98,0x20,(uchar *)na);
          uVar10 = auStack_1c88._0_8_ & 0xffffffff;
          if (*(int *)(auStack_1c68 + uVar10 * 4) == 0) {
            uVar29 = (int)auStack_1c88._0_8_ * (int)psStack_1c98 + iVar7;
            iVar8 = 0;
            iVar26 = 0;
            do {
              if (iVar8 == 0xe) {
                testrand256(auStack_1af8);
                uVar32 = 0;
              }
              else {
                auStack_1af8 = (undefined1  [16])0x0;
                auStack_1ae8._0_12_ = SUB1612((undefined1  [16])0x0,0);
                auStack_1ae8._12_4_ = 0;
                uVar32 = 0;
                if (iVar8 != 0xd && iVar7 != -1) {
                  uVar32 = (uint)(uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) == iVar8);
                }
              }
              psVar42 = psStack_1cb8;
              na = (secp256k1_scratch *)(auStack_11f8 + (long)puVar35 * 0x40);
              uVar9 = secp256k1_schnorrsig_verify
                                (psStack_1cb8,auStack_1b18,auStack_1b98,0x20,
                                 (secp256k1_xonly_pubkey *)(auStack_11f8 + (long)puVar35 * 0x40));
              if (uVar9 != uVar32) goto LAB_00114ba6;
              iVar26 = iVar26 + uVar9;
              iVar8 = iVar8 + 1;
            } while (iVar8 != 0xf);
            if (iVar26 != auStack_1bf8._64_4_) goto LAB_00114bab;
            *(undefined4 *)(auStack_1c68 + uVar10 * 4) = 1;
            iVar6 = iVar6 + 1;
          }
        } while (iVar6 < 0xd);
      }
      uStack_1cc8 = uStack_1cc8 + 1;
    } while (uStack_1cc8 != 0xe);
    puStack_1ca8 = puStack_1ca8 + 1;
  } while (puStack_1ca8 != (undefined1 *)0x7);
  lVar11 = 0x68;
  iVar6 = 1;
  do {
    auStack_1c68._0_4_ = iVar6;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c68);
    auStack_1b18 = (undefined1  [16])0x0;
    auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1b08[0xf] = (char)iVar6;
    psVar42 = psStack_1cb8;
    iVar7 = secp256k1_ellswift_create(psStack_1cb8,auStack_11f8,auStack_1b18,(uchar *)0x0);
    psVar15 = psStack_1cb8;
    if (iVar7 == 0) goto LAB_00114bb0;
    secp256k1_ellswift_decode(psStack_1cb8,(secp256k1_pubkey *)auStack_1978,auStack_11f8);
    psVar42 = asStack_1678;
    secp256k1_pubkey_load(psVar15,(secp256k1_ge *)psVar42,(secp256k1_pubkey *)auStack_1978);
    iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)psVar42,(secp256k1_ge *)(auStack_ef8 + lVar11));
    if (iVar7 == 0) goto LAB_00114bb5;
    lVar11 = lVar11 + 0x68;
    iVar6 = iVar6 + 1;
  } while (lVar11 != 0x548);
  secp256k1_context_destroy(psStack_1cb8);
  iVar6 = count;
  goto joined_r0x0011246c;
LAB_00114a70:
  main_cold_4();
LAB_00114a75:
  main_cold_5();
LAB_00114a7a:
  main_cold_6();
LAB_00114a7f:
  main_cold_69();
LAB_00114a84:
  main_cold_68();
LAB_00114a89:
  main_cold_67();
LAB_00114a8e:
  main_cold_7();
LAB_00114a93:
  main_cold_8();
LAB_00114a98:
  main_cold_50();
LAB_00114a9d:
  psVar42 = psVar15;
  main_cold_61();
LAB_00114aa2:
  main_cold_60();
LAB_00114aa7:
  main_cold_59();
LAB_00114aac:
  main_cold_58();
LAB_00114ab1:
  main_cold_56();
LAB_00114ab6:
  psVar15 = psVar42;
  main_cold_55();
LAB_00114abb:
  main_cold_54();
LAB_00114ac0:
  psVar42 = psVar15;
  main_cold_52();
LAB_00114ac5:
  main_cold_51();
LAB_00114aca:
  main_cold_71();
LAB_00114acf:
  main_cold_3();
LAB_00114ad4:
  main_cold_70();
LAB_00114ad9:
  main_cold_66();
LAB_00114ade:
  main_cold_65();
  goto LAB_00114ae3;
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
    secp256k1_ecmult_const(&rj, &p, q);
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}